

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughMeshTransformInfoHTC *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  long lVar2;
  undefined8 uVar3;
  XrPassthroughMeshTransformInfoHTC *pXVar4;
  bool bVar5;
  XrInstance pXVar6;
  ostream *poVar7;
  invalid_argument *piVar8;
  XrPosef *value_01;
  XrVector3f *value_02;
  allocator local_d49;
  string local_d48 [32];
  string local_d28 [32];
  string local_d08 [8];
  string scale_prefix;
  allocator local_ce1;
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [8];
  string pose_prefix;
  __cxx11 local_c80 [32];
  string local_c60 [8];
  string time_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40 [32];
  ostringstream local_c20 [8];
  ostringstream oss_baseSpace;
  string local_aa8 [8];
  string basespace_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88 [32];
  ostringstream local_a68 [8];
  ostringstream oss_indices;
  __cxx11 local_8f0 [32];
  string local_8d0 [8];
  string indices_array_prefix;
  uint local_8ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8 [4];
  uint32_t value_indices_inc;
  ostringstream local_888 [8];
  ostringstream oss_indices_array;
  string local_710 [8];
  string indices_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0 [32];
  ostringstream local_6d0 [8];
  ostringstream oss_indexCount;
  string local_558 [8];
  string indexcount_prefix;
  allocator local_531;
  string local_530 [32];
  string local_510 [32];
  __cxx11 local_4f0 [32];
  string local_4d0 [8];
  string vertices_array_prefix;
  uint local_4ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [4];
  uint32_t value_vertices_inc;
  ostringstream local_488 [8];
  ostringstream oss_vertices_array;
  string local_310 [8];
  string vertices_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [32];
  ostringstream local_2d0 [8];
  ostringstream oss_vertexCount;
  string local_158 [8];
  string vertexcount_prefix;
  string local_138 [32];
  string local_118 [8];
  string next_prefix;
  __cxx11 local_f8 [32];
  char acStack_d8 [8];
  char type_string_1 [64];
  string local_90 [8];
  string type_prefix;
  undefined1 local_60 [40];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrPassthroughMeshTransformInfoHTC *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_60._32_8_ = contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrPassthroughMeshTransformInfoHTC *)gen_dispatch_table;
  PointerToHexString<XrPassthroughMeshTransformInfoHTC>
            ((XrPassthroughMeshTransformInfoHTC *)local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"type");
  uVar3 = local_60._32_8_;
  if (value_local == (XrPassthroughMeshTransformInfoHTC *)0x0) {
    std::__cxx11::to_string(local_f8,*(int *)prefix_local);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar3,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    acStack_d8[0] = '\0';
    acStack_d8[1] = '\0';
    acStack_d8[2] = '\0';
    acStack_d8[3] = '\0';
    acStack_d8[4] = '\0';
    acStack_d8[5] = '\0';
    acStack_d8[6] = '\0';
    acStack_d8[7] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    pcVar1 = *(code **)&(value_local->pose).orientation;
    pXVar6 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
    (*pcVar1)(pXVar6,*(undefined4 *)prefix_local,acStack_d8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)local_60._32_8_,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [64])acStack_d8);
  }
  std::__cxx11::string::string(local_118,(string *)prefix);
  std::__cxx11::string::operator+=(local_118,"next");
  pXVar4 = value_local;
  value_00 = *(void **)(prefix_local + 8);
  std::__cxx11::string::string(local_138,local_118);
  bVar5 = ApiDumpDecodeNextChain
                    ((XrGeneratedDispatchTable *)pXVar4,value_00,(string *)local_138,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_138);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string(local_158,(string *)prefix);
  std::__cxx11::string::operator+=(local_158,"vertexCount");
  std::__cxx11::ostringstream::ostringstream(local_2d0);
  poVar7 = std::operator<<((ostream *)local_2d0,"0x");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
  std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x10));
  uVar3 = local_60._32_8_;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar3,(char (*) [9])"uint32_t",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
             local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::string(local_310,(string *)prefix);
  std::__cxx11::string::operator+=(local_310,"vertices");
  std::__cxx11::ostringstream::ostringstream(local_488);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_488,std::hex);
  std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x18));
  uVar3 = local_60._32_8_;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[18],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar3,(char (*) [18])"const XrVector3f*",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
             local_4a8);
  std::__cxx11::string::~string((string *)local_4a8);
  for (local_4ac = 0; local_4ac < *(uint *)(prefix_local + 0x10); local_4ac = local_4ac + 1) {
    std::__cxx11::string::string(local_4d0,local_310);
    std::__cxx11::string::operator+=(local_4d0,"[");
    std::__cxx11::to_string(local_4f0,local_4ac);
    std::__cxx11::string::operator+=(local_4d0,(string *)local_4f0);
    std::__cxx11::string::~string((string *)local_4f0);
    std::__cxx11::string::operator+=(local_4d0,"]");
    pXVar4 = value_local;
    lVar2 = *(long *)(prefix_local + 0x18);
    std::__cxx11::string::string(local_510,local_4d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"const XrVector3f*",&local_531);
    bVar5 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)pXVar4,
                       (XrVector3f *)(lVar2 + (ulong)local_4ac * 0xc),(string *)local_510,
                       (string *)local_530,false,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_60._32_8_);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    std::__cxx11::string::~string(local_510);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::~string(local_4d0);
  }
  std::__cxx11::string::string(local_558,(string *)prefix);
  std::__cxx11::string::operator+=(local_558,"indexCount");
  std::__cxx11::ostringstream::ostringstream(local_6d0);
  poVar7 = std::operator<<((ostream *)local_6d0,"0x");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
  std::ostream::operator<<(poVar7,*(uint *)(prefix_local + 0x20));
  uVar3 = local_60._32_8_;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar3,(char (*) [9])"uint32_t",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
             local_6f0);
  std::__cxx11::string::~string((string *)local_6f0);
  std::__cxx11::string::string(local_710,(string *)prefix);
  std::__cxx11::string::operator+=(local_710,"indices");
  std::__cxx11::ostringstream::ostringstream(local_888);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_888,std::hex);
  std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x28));
  uVar3 = local_60._32_8_;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar3,(char (*) [16])"const uint32_t*",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_710,
             local_8a8);
  std::__cxx11::string::~string((string *)local_8a8);
  for (local_8ac = 0; local_8ac < *(uint *)(prefix_local + 0x20); local_8ac = local_8ac + 1) {
    std::__cxx11::string::string(local_8d0,local_710);
    std::__cxx11::string::operator+=(local_8d0,"[");
    std::__cxx11::to_string(local_8f0,local_8ac);
    std::__cxx11::string::operator+=(local_8d0,(string *)local_8f0);
    std::__cxx11::string::~string((string *)local_8f0);
    std::__cxx11::string::operator+=(local_8d0,"]");
    std::__cxx11::ostringstream::ostringstream(local_a68);
    poVar7 = std::operator<<((ostream *)local_a68,"0x");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::hex);
    std::ostream::operator<<
              (poVar7,*(uint *)(*(long *)(prefix_local + 0x28) + (ulong)local_8ac * 4));
    uVar3 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar3,(char (*) [16])"const uint32_t*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d0,
               local_a88);
    std::__cxx11::string::~string((string *)local_a88);
    std::__cxx11::ostringstream::~ostringstream(local_a68);
    std::__cxx11::string::~string(local_8d0);
  }
  std::__cxx11::string::string(local_aa8,(string *)prefix);
  std::__cxx11::string::operator+=(local_aa8,"baseSpace");
  std::__cxx11::ostringstream::ostringstream(local_c20);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_c20,std::hex);
  std::ostream::operator<<(poVar7,*(void **)(prefix_local + 0x30));
  uVar3 = local_60._32_8_;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar3,(char (*) [8])"XrSpace",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8,
             local_c40);
  std::__cxx11::string::~string((string *)local_c40);
  std::__cxx11::string::string(local_c60,(string *)prefix);
  std::__cxx11::string::operator+=(local_c60,"time");
  uVar3 = local_60._32_8_;
  std::__cxx11::to_string(local_c80,*(long *)(prefix_local + 0x38));
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar3,(char (*) [7])"XrTime",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c80);
  std::__cxx11::string::~string((string *)local_c80);
  std::__cxx11::string::string(local_ca0,(string *)prefix);
  std::__cxx11::string::operator+=(local_ca0,"pose");
  pXVar4 = value_local;
  value_01 = (XrPosef *)(prefix_local + 0x40);
  std::__cxx11::string::string(local_cc0,local_ca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"XrPosef",&local_ce1);
  bVar5 = ApiDumpOutputXrStruct
                    ((XrGeneratedDispatchTable *)pXVar4,value_01,(string *)local_cc0,
                     (string *)local_ce0,false,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  std::__cxx11::string::~string(local_cc0);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_d08,(string *)prefix);
    std::__cxx11::string::operator+=(local_d08,"scale");
    pXVar4 = value_local;
    value_02 = (XrVector3f *)(prefix_local + 0x5c);
    std::__cxx11::string::string(local_d28,local_d08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d48,"XrVector3f",&local_d49);
    bVar5 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)pXVar4,value_02,(string *)local_d28,
                       (string *)local_d48,false,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_60._32_8_);
    std::__cxx11::string::~string(local_d48);
    std::allocator<char>::~allocator((allocator<char> *)&local_d49);
    std::__cxx11::string::~string(local_d28);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      gen_dispatch_table_local._7_1_ = 1;
      std::__cxx11::string::~string(local_d08);
      std::__cxx11::string::~string(local_ca0);
      std::__cxx11::string::~string(local_c60);
      std::__cxx11::ostringstream::~ostringstream(local_c20);
      std::__cxx11::string::~string(local_aa8);
      std::__cxx11::ostringstream::~ostringstream(local_888);
      std::__cxx11::string::~string(local_710);
      std::__cxx11::ostringstream::~ostringstream(local_6d0);
      std::__cxx11::string::~string(local_558);
      std::__cxx11::ostringstream::~ostringstream(local_488);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::ostringstream::~ostringstream(local_2d0);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_90);
      return (bool)(gen_dispatch_table_local._7_1_ & 1);
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughMeshTransformInfoHTC* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexcount_prefix = prefix;
        vertexcount_prefix += "vertexCount";
        std::ostringstream oss_vertexCount;
        oss_vertexCount << "0x" << std::hex << (value->vertexCount);
        contents.emplace_back("uint32_t", vertexcount_prefix, oss_vertexCount.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices_array;
        oss_vertices_array << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("const XrVector3f*", vertices_prefix, oss_vertices_array.str());
        for (uint32_t value_vertices_inc = 0; value_vertices_inc < value->vertexCount; ++value_vertices_inc) {
            std::string vertices_array_prefix = vertices_prefix;
            vertices_array_prefix += "[";
            vertices_array_prefix += std::to_string(value_vertices_inc);
            vertices_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->vertices[value_vertices_inc], vertices_array_prefix, "const XrVector3f*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        std::string indexcount_prefix = prefix;
        indexcount_prefix += "indexCount";
        std::ostringstream oss_indexCount;
        oss_indexCount << "0x" << std::hex << (value->indexCount);
        contents.emplace_back("uint32_t", indexcount_prefix, oss_indexCount.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices_array;
        oss_indices_array << std::hex << (value->indices);
        contents.emplace_back("const uint32_t*", indices_prefix, oss_indices_array.str());
        for (uint32_t value_indices_inc = 0; value_indices_inc < value->indexCount; ++value_indices_inc) {
            std::string indices_array_prefix = indices_prefix;
            indices_array_prefix += "[";
            indices_array_prefix += std::to_string(value_indices_inc);
            indices_array_prefix += "]";
            std::ostringstream oss_indices;
            oss_indices << "0x" << std::hex << (value->indices[value_indices_inc]);
            contents.emplace_back("const uint32_t*", indices_array_prefix, oss_indices.str());
        }
        std::string basespace_prefix = prefix;
        basespace_prefix += "baseSpace";
        std::ostringstream oss_baseSpace;
        oss_baseSpace << std::hex << reinterpret_cast<const void*>(value->baseSpace);
        contents.emplace_back("XrSpace", basespace_prefix, oss_baseSpace.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string scale_prefix = prefix;
        scale_prefix += "scale";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->scale, scale_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}